

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForInObjectEnumerator.cpp
# Opt level: O3

BOOL __thiscall
Js::ForInObjectEnumerator::InitializeCurrentEnumerator
          (ForInObjectEnumerator *this,RecyclableObject *object,EnumeratorFlags flags,
          ScriptContext *scriptContext,EnumeratorCache *forInCache)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ForInObjectEnumerator.cpp"
                                ,0x86,"(object)","object");
    if (!bVar3) goto LAB_00b489c2;
    *puVar6 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ForInObjectEnumerator.cpp"
                                ,0x87,"(scriptContext)","scriptContext");
    if (!bVar3) {
LAB_00b489c2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pp_Var1 = (object->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject;
  if (pp_Var1 == (_func_int **)VirtualTableInfo<Js::DynamicObject>::Address) {
    BVar4 = DynamicObject::GetEnumerator
                      ((DynamicObject *)object,&this->enumerator,flags,scriptContext,forInCache);
    return BVar4;
  }
  iVar5 = (*pp_Var1[0x2b])(object,this,(ulong)flags,scriptContext);
  return iVar5;
}

Assistant:

BOOL ForInObjectEnumerator::InitializeCurrentEnumerator(RecyclableObject * object, EnumeratorFlags flags,  ScriptContext * scriptContext, EnumeratorCache * forInCache)
    {
        Assert(object);
        Assert(scriptContext);

        if (VirtualTableInfo<DynamicObject>::HasVirtualTable(object))
        {
            DynamicObject* dynamicObject = (DynamicObject*)object;
            return dynamicObject->DynamicObject::GetEnumerator(&enumerator, flags, scriptContext, forInCache);
        }

        return object->GetEnumerator(&enumerator, flags, scriptContext, forInCache);
    }